

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O0

void __thiscall
llvm::StringRef::split
          (StringRef *this,SmallVectorImpl<llvm::StringRef> *A,char Separator,int MaxSplit,
          bool KeepEmpty)

{
  unsigned_long *puVar1;
  StringRef local_108;
  unsigned_long local_f8;
  size_t Idx;
  StringRef S;
  int local_d8;
  bool KeepEmpty_local;
  int MaxSplit_local;
  char Separator_local;
  SmallVectorImpl<llvm::StringRef> *A_local;
  StringRef *this_local;
  unsigned_long local_b8;
  size_t *local_b0;
  undefined1 local_a8 [16];
  unsigned_long local_98;
  unsigned_long local_90;
  size_t *local_88;
  undefined1 local_80 [16];
  size_t *local_70;
  void *local_68;
  void *P;
  size_t FindBegin;
  char local_49;
  size_t *local_48;
  unsigned_long local_40;
  size_t local_38;
  char *local_30;
  undefined1 *local_28;
  char *local_20;
  size_t local_18;
  undefined1 *local_10;
  
  Idx = (size_t)this->Data;
  S.Data = (char *)this->Length;
  S.Length._7_1_ = KeepEmpty;
  local_d8 = MaxSplit;
  while (local_d8 != 0) {
    local_48 = &Idx;
    FindBegin = 0;
    local_49 = Separator;
    puVar1 = std::min<unsigned_long>(&FindBegin,(unsigned_long *)&S);
    P = (void *)*puVar1;
    if ((P < S.Data) &&
       (local_68 = memchr((char *)((long)P + Idx),(int)local_49,(long)S.Data - (long)P),
       local_68 != (void *)0x0)) {
      local_40 = (long)local_68 - Idx;
    }
    else {
      local_40 = 0xffffffffffffffff;
    }
    local_f8 = local_40;
    if (local_40 == 0xffffffffffffffff) break;
    if (((S.Length._7_1_ & 1) != 0) || (local_40 != 0)) {
      local_88 = &Idx;
      local_90 = 0;
      local_98 = local_40;
      puVar1 = std::min<unsigned_long>(&local_90,(unsigned_long *)&S);
      local_90 = *puVar1;
      puVar1 = std::max<unsigned_long>(&local_90,&local_98);
      puVar1 = std::min<unsigned_long>(puVar1,(unsigned_long *)&S);
      local_98 = *puVar1;
      local_108.Data = (char *)(Idx + local_90);
      local_108.Length = local_98 - local_90;
      local_28 = local_80;
      local_38 = local_108.Length;
      local_30 = local_108.Data;
      SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
                (&A->super_SmallVectorTemplateBase<llvm::StringRef,_true>,&local_108);
    }
    local_b8 = local_f8 + 1;
    local_b0 = &Idx;
    this_local = (StringRef *)0xffffffffffffffff;
    puVar1 = std::min<unsigned_long>(&local_b8,(unsigned_long *)&S);
    local_b8 = *puVar1;
    puVar1 = std::max<unsigned_long>(&local_b8,(unsigned_long *)&this_local);
    puVar1 = std::min<unsigned_long>(puVar1,(unsigned_long *)&S);
    this_local = (StringRef *)*puVar1;
    Idx = Idx + local_b8;
    S.Data = (char *)((long)this_local - local_b8);
    local_10 = local_a8;
    local_d8 = local_d8 + -1;
    local_20 = S.Data;
    local_18 = Idx;
  }
  if (((S.Length._7_1_ & 1) != 0) || (local_70 = &Idx, S.Data != (char *)0x0)) {
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
              (&A->super_SmallVectorTemplateBase<llvm::StringRef,_true>,(StringRef *)&Idx);
  }
  return;
}

Assistant:

void StringRef::split(SmallVectorImpl<StringRef> &A, char Separator,
                      int MaxSplit, bool KeepEmpty) const {
  StringRef S = *this;

  // Count down from MaxSplit. When MaxSplit is -1, this will just split
  // "forever". This doesn't support splitting more than 2^31 times
  // intentionally; if we ever want that we can make MaxSplit a 64-bit integer
  // but that seems unlikely to be useful.
  while (MaxSplit-- != 0) {
    size_t Idx = S.find(Separator);
    if (Idx == npos)
      break;

    // Push this split.
    if (KeepEmpty || Idx > 0)
      A.push_back(S.slice(0, Idx));

    // Jump forward.
    S = S.slice(Idx + 1, npos);
  }

  // Push the tail.
  if (KeepEmpty || !S.empty())
    A.push_back(S);
}